

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesWidget.cxx
# Opt level: O0

void __thiscall
cmCursesWidget::cmCursesWidget(cmCursesWidget *this,int width,int height,int left,int top)

{
  FIELD *pFVar1;
  int top_local;
  int left_local;
  int height_local;
  int width_local;
  cmCursesWidget *this_local;
  
  this->_vptr_cmCursesWidget = (_func_int **)&PTR__cmCursesWidget_00a77ad0;
  std::__cxx11::string::string((string *)&this->Value);
  pFVar1 = new_field(height,width,top,left,0,0);
  this->Field = pFVar1;
  set_field_userptr(this->Field,this);
  field_opts_off(this->Field,0x40);
  this->Page = 0;
  return;
}

Assistant:

cmCursesWidget::cmCursesWidget(int width, int height, int left, int top)
{
  this->Field = new_field(height, width, top, left, 0, 0);
  set_field_userptr(this->Field, reinterpret_cast<char*>(this));
  field_opts_off(this->Field,  O_AUTOSKIP);
  this->Page = 0;
}